

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneFormat::setGMTZeroFormat
          (TimeZoneFormat *this,UnicodeString *gmtZeroFormat,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UnicodeString *gmtZeroFormat_local;
  TimeZoneFormat *this_local;
  
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    UVar1 = UnicodeString::isEmpty(gmtZeroFormat);
    if (UVar1 == '\0') {
      UVar1 = UnicodeString::operator!=(gmtZeroFormat,&this->fGMTZeroFormat);
      if (UVar1 != '\0') {
        UnicodeString::setTo(&this->fGMTZeroFormat,gmtZeroFormat);
      }
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

void
TimeZoneFormat::setGMTZeroFormat(const UnicodeString& gmtZeroFormat, UErrorCode& status) {
    if (U_SUCCESS(status)) {
        if (gmtZeroFormat.isEmpty()) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
        } else if (gmtZeroFormat != fGMTZeroFormat) {
            fGMTZeroFormat.setTo(gmtZeroFormat);
        }
    }
}